

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

double __thiscall ON_Line::MinimumDistanceTo(ON_Line *this,ON_Line *L)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double t;
  double b;
  double a;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar1 = ON_Intersect(this,L,&local_80,&local_90);
  if (0.0 <= local_80) {
    if (1.0 < local_80) {
      local_80 = 1.0;
      goto LAB_004ccc8d;
    }
    bVar2 = !bVar1;
  }
  else {
    local_80 = 0.0;
LAB_004ccc8d:
    bVar2 = true;
  }
  if (0.0 <= local_90) {
    if (local_90 <= 1.0) {
      bVar1 = !bVar1;
      goto LAB_004cccd2;
    }
    local_90 = 1.0;
  }
  else {
    local_90 = 0.0;
  }
  bVar1 = true;
LAB_004cccd2:
  PointAt(&local_60,this,local_80);
  PointAt(&local_78,L,local_90);
  local_88 = ON_3dPoint::DistanceTo(&local_60,&local_78);
  if (bVar2) {
    ClosestPointTo(L,&local_60,&local_98);
    if (0.0 <= local_98) {
      if (1.0 < local_98) {
        local_98 = 1.0;
      }
    }
    else {
      local_98 = 0.0;
    }
    PointAt(&local_48,L,local_98);
    dVar3 = ON_3dPoint::DistanceTo(&local_48,&local_60);
    if (dVar3 < local_88) {
      local_88 = dVar3;
    }
  }
  if (bVar1) {
    ClosestPointTo(this,&local_78,&local_98);
    if (0.0 <= local_98) {
      if (1.0 < local_98) {
        local_98 = 1.0;
      }
    }
    else {
      local_98 = 0.0;
    }
    PointAt(&local_48,this,local_98);
    dVar3 = ON_3dPoint::DistanceTo(&local_48,&local_78);
    if (dVar3 < local_88) {
      local_88 = dVar3;
    }
  }
  return local_88;
}

Assistant:

double ON_Line::MinimumDistanceTo( const ON_Line& L ) const
{
  ON_3dPoint A, B;
  double a, b, t, x, d;
  bool bCheckA, bCheckB;

  bool bGoodX = ON_Intersect(*this,L,&a,&b);

  bCheckA = true;
  if ( a < 0.0) a = 0.0; else if (a > 1.0) a = 1.0; else bCheckA=!bGoodX;
  bCheckB = true;
  if ( b < 0.0) b = 0.0; else if (b > 1.0) b = 1.0; else bCheckB=!bGoodX;

  A = PointAt(a);
  B = L.PointAt(b);
  d = A.DistanceTo(B);

  if ( bCheckA )
  {
    L.ClosestPointTo(A,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = L.PointAt(t).DistanceTo(A);
    if ( x < d )
      d = x;
  }

  if ( bCheckB )
  {
    ClosestPointTo(B,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = PointAt(t).DistanceTo(B);
    if (x < d )
      d = x;
  }
 
  return d;
}